

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void affect_remove_obj(OBJ_DATA *obj,OBJ_AFFECT_DATA *paf,bool show)

{
  string_view fmt;
  string_view fmt_00;
  int iVar1;
  undefined1 in_DL;
  OBJ_DATA *in_RSI;
  char *in_RDI;
  OBJ_AFFECT_DATA *prev;
  long vector [2];
  int where;
  long *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  OBJ_DATA *in_stack_ffffffffffffffc0;
  CLogger *in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar2;
  
  uVar2 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if (*(long *)(in_RDI + 0x40) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    fmt._M_str._0_7_ = in_stack_ffffffffffffffe0;
    fmt._M_len = in_stack_ffffffffffffffd8;
    fmt._M_str._7_1_ = in_stack_ffffffffffffffe7;
    CLogger::Warn<>(in_stack_ffffffffffffffd0,fmt);
  }
  else {
    if ((in_RSI->charaffs != (AFFECT_DATA *)0x0) && ((char)(uVar2 >> 0x18) != '\0')) {
      (*(code *)in_RSI->charaffs)(in_RDI,in_RSI);
    }
    affect_modify_obj(in_RSI,(OBJ_AFFECT_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                      (bool)in_stack_ffffffffffffffe7);
    iVar1 = (int)*(short *)((long)&in_RSI->contains + 2);
    copy_vector((long *)&stack0xffffffffffffffd8,(long *)&in_RSI->on);
    if (in_RSI == *(OBJ_DATA **)(in_RDI + 0x40)) {
      *(OBJ_DATA **)(in_RDI + 0x40) = in_RSI->next;
    }
    else {
      for (in_stack_ffffffffffffffc0 = *(OBJ_DATA **)(in_RDI + 0x40);
          in_stack_ffffffffffffffc0 != (OBJ_DATA *)0x0;
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0->next) {
        if (in_stack_ffffffffffffffc0->next == in_RSI) {
          in_stack_ffffffffffffffc0->next = in_RSI->next;
          break;
        }
      }
      if (in_stack_ffffffffffffffc0 == (OBJ_DATA *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)0x0,
                   (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        fmt_00._M_str = in_RDI;
        fmt_00._M_len = (size_t)in_RSI;
        CLogger::Warn<short&>
                  ((CLogger *)CONCAT44(uVar2,iVar1),fmt_00,
                   (short *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
        return;
      }
    }
    free_affect_obj((OBJ_AFFECT_DATA *)in_RSI);
    affect_check_obj(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void affect_remove_obj(OBJ_DATA *obj, OBJ_AFFECT_DATA *paf, bool show)
{
	int where;
	long vector[MAX_BITVECTOR];

	if (!obj->affected)
	{
		RS.Logger.Warn("affect_remove_obj: no affect!");
		return;
	}

	if (paf->end_fun != nullptr && show)
		(*paf->end_fun)(obj, paf);

	affect_modify_obj(obj, paf, false);
	where = paf->where;
	copy_vector(vector, paf->bitvector);

	if (paf == obj->affected)
	{
		obj->affected = paf->next;
	}
	else
	{
		OBJ_AFFECT_DATA *prev;

		for (prev = obj->affected; prev != nullptr; prev = prev->next)
		{
			if (prev->next == paf)
			{
				prev->next = paf->next;
				break;
			}
		}

		if (!prev)
		{
			RS.Logger.Warn("affect_remove_obj: cannot find paf on obj #{}!", obj->pIndexData->vnum);
			return;
		}
	}

	free_affect_obj(paf);
	affect_check_obj(obj, where, vector);
}